

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ObjIsPi(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((~(uint)*(undefined8 *)pObj & 0x9fffffff) == 0) {
    uVar1 = (uint)((int)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <
                  p->vCis->nSize - p->nRegs);
  }
  return uVar1;
}

Assistant:

static inline int          Gia_ObjIsPi( Gia_Man_t * p, Gia_Obj_t * pObj )      { return Gia_ObjIsCi(pObj) && Gia_ObjCioId(pObj) < Gia_ManPiNum(p);   }